

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O2

void __thiscall
ConsistencyChecker::printOpError
          (ConsistencyChecker *this,OpTpl *op,Constructor *ct,int4 err1,int4 err2,string *msg)

{
  long lVar1;
  SleighCompile *this_00;
  OperandSymbol *pOVar2;
  OperandSymbol *pOVar3;
  ostream *poVar4;
  ConsistencyChecker *pCVar5;
  Location *loc;
  char *pcVar6;
  char *pcVar7;
  ostringstream msgBuilder;
  string local_1c8;
  ConsistencyChecker local_1a8 [3];
  
  lVar1 = *(long *)(ct + 8);
  pCVar5 = this;
  pOVar2 = getOperandSymbol(this,err1,op,ct);
  if (err2 == err1) {
    pOVar3 = (OperandSymbol *)0x0;
  }
  else {
    pOVar3 = getOperandSymbol(pCVar5,err2,op,ct);
  }
  pCVar5 = local_1a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar5);
  poVar4 = std::operator<<((ostream *)pCVar5,"Size restriction error in table \'");
  poVar4 = std::operator<<(poVar4,(string *)(lVar1 + 8));
  pcVar6 = "\'";
  poVar4 = std::operator<<(poVar4,"\'");
  std::endl<char,std::char_traits<char>>(poVar4);
  if (pOVar3 == (OperandSymbol *)0x0 || pOVar2 == (OperandSymbol *)0x0) {
    if (pOVar2 == (OperandSymbol *)0x0) {
      if (pOVar3 == (OperandSymbol *)0x0) {
        pcVar6 = "  Problem";
        goto LAB_0010d735;
      }
      pcVar7 = "  Problem with operand 2 \'";
      goto LAB_0010d6fc;
    }
    poVar4 = std::operator<<((ostream *)local_1a8,"  Problem with operand 1 \'");
  }
  else {
    poVar4 = std::operator<<((ostream *)local_1a8,"  Problem with operands \'");
    pCVar5 = (ConsistencyChecker *)std::operator<<(poVar4,(string *)(pOVar2 + 8));
    pcVar7 = "\' and \'";
LAB_0010d6fc:
    poVar4 = std::operator<<((ostream *)pCVar5,pcVar7);
    pOVar2 = pOVar3;
  }
  pCVar5 = (ConsistencyChecker *)std::operator<<(poVar4,(string *)(pOVar2 + 8));
LAB_0010d735:
  std::operator<<((ostream *)pCVar5,pcVar6);
  pCVar5 = local_1a8;
  std::operator<<((ostream *)pCVar5," in ");
  printOpName(pCVar5,(ostream *)local_1a8,op);
  poVar4 = std::operator<<((ostream *)local_1a8," operator");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"  ");
  std::operator<<(poVar4,(string *)msg);
  this_00 = this->compiler;
  loc = SleighCompile::getLocation(this_00,ct);
  std::__cxx11::stringbuf::str();
  SleighCompile::reportError(this_00,loc,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return;
}

Assistant:

void ConsistencyChecker::printOpError(OpTpl *op,Constructor *ct,int4 err1,int4 err2,const string &msg)

{
  SubtableSymbol *sym = ct->getParent();
  OperandSymbol *op1,*op2;

  op1 = getOperandSymbol(err1,op,ct);
  if (err2 != err1)
    op2 = getOperandSymbol(err2,op,ct);
  else
    op2 = (OperandSymbol *)0;

  ostringstream msgBuilder;

  msgBuilder << "Size restriction error in table '" << sym->getName() << "'" << endl;
  if ((op1 != (OperandSymbol *)0)&&(op2 != (OperandSymbol *)0))
    msgBuilder << "  Problem with operands '" << op1->getName() << "' and '" << op2->getName() << "'";
  else if (op1 != (OperandSymbol *)0)
    msgBuilder << "  Problem with operand 1 '" << op1->getName() << "'";
  else if (op2 != (OperandSymbol *)0)
    msgBuilder << "  Problem with operand 2 '" << op2->getName() << "'";
  else
    msgBuilder << "  Problem";
  msgBuilder << " in ";
  printOpName(msgBuilder,op);
  msgBuilder << " operator" << endl << "  " << msg;

  compiler->reportError(compiler->getLocation(ct), msgBuilder.str());
}